

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O2

void write_file_header(j_compress_ptr cinfo)

{
  jpeg_marker_writer *pjVar1;
  int val;
  
  pjVar1 = cinfo->marker;
  emit_marker(cinfo,M_SOI);
  *(undefined4 *)&pjVar1[1].write_file_header = 0;
  if (cinfo->write_JFIF_header != 0) {
    emit_marker(cinfo,M_APP0);
    emit_2bytes(cinfo,0x10);
    emit_byte(cinfo,0x4a);
    emit_byte(cinfo,0x46);
    emit_byte(cinfo,0x49);
    emit_byte(cinfo,0x46);
    emit_byte(cinfo,0);
    emit_byte(cinfo,(uint)cinfo->JFIF_major_version);
    emit_byte(cinfo,(uint)cinfo->JFIF_minor_version);
    emit_byte(cinfo,(uint)cinfo->density_unit);
    emit_2bytes(cinfo,(uint)cinfo->X_density);
    emit_2bytes(cinfo,(uint)cinfo->Y_density);
    emit_byte(cinfo,0);
    emit_byte(cinfo,0);
  }
  if (cinfo->write_Adobe_marker != 0) {
    emit_marker(cinfo,M_APP14);
    emit_2bytes(cinfo,0xe);
    emit_byte(cinfo,0x41);
    emit_byte(cinfo,100);
    emit_byte(cinfo,0x6f);
    emit_byte(cinfo,0x62);
    emit_byte(cinfo,0x65);
    emit_2bytes(cinfo,100);
    emit_2bytes(cinfo,0);
    emit_2bytes(cinfo,0);
    val = 1;
    if (cinfo->jpeg_color_space != JCS_YCbCr) {
      val = (uint)(cinfo->jpeg_color_space == JCS_YCCK) * 2;
    }
    emit_byte(cinfo,val);
    return;
  }
  return;
}

Assistant:

METHODDEF(void)
write_file_header(j_compress_ptr cinfo)
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;

  emit_marker(cinfo, M_SOI);    /* first the SOI */

  /* SOI is defined to reset restart interval to 0 */
  marker->last_restart_interval = 0;

  if (cinfo->write_JFIF_header) /* next an optional JFIF APP0 */
    emit_jfif_app0(cinfo);
  if (cinfo->write_Adobe_marker) /* next an optional Adobe APP14 */
    emit_adobe_app14(cinfo);
}